

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O2

void ps_search_base_reinit(ps_search_t *search,dict_t *dict,dict2pid_t *d2p)

{
  dict_t *pdVar1;
  dict2pid_t *pdVar2;
  s3wid_t sVar3;
  int32 iVar4;
  undefined8 uVar5;
  
  dict_free(search->dict);
  dict2pid_free(search->d2p);
  if (dict == (dict_t *)0x0) {
    uVar5 = 0xffffffffffffffff;
    pdVar1 = (dict_t *)0x0;
    sVar3 = -1;
    iVar4 = 0;
  }
  else {
    pdVar1 = dict_retain(dict);
    iVar4 = dict->n_word;
    sVar3 = dict->startwid;
    uVar5._0_4_ = dict->finishwid;
    uVar5._4_4_ = dict->silwid;
  }
  search->dict = pdVar1;
  search->silence_wid = (int)((ulong)uVar5 >> 0x20);
  search->finish_wid = (int)uVar5;
  search->start_wid = sVar3;
  search->n_words = iVar4;
  if (d2p == (dict2pid_t *)0x0) {
    pdVar2 = (dict2pid_t *)0x0;
  }
  else {
    pdVar2 = dict2pid_retain(d2p);
  }
  search->d2p = pdVar2;
  return;
}

Assistant:

void
ps_search_base_reinit(ps_search_t *search, dict_t *dict,
                      dict2pid_t *d2p)
{
    dict_free(search->dict);
    dict2pid_free(search->d2p);
    /* FIXME: _retain() should just return NULL if passed NULL. */
    if (dict) {
        search->dict = dict_retain(dict);
        search->start_wid = dict_startwid(dict);
        search->finish_wid = dict_finishwid(dict);
        search->silence_wid = dict_silwid(dict);
        search->n_words = dict_size(dict);
    }
    else {
        search->dict = NULL;
        search->start_wid = search->finish_wid = search->silence_wid = -1;
        search->n_words = 0;
    }
    if (d2p)
        search->d2p = dict2pid_retain(d2p);
    else
        search->d2p = NULL;
}